

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<int,_false> __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
::
binary_search_impl<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::upper_bound_adapter<absl::container_internal::key_compare_adapter<compare_ptr,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>::checked_compare>>
          (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
           *this,undefined8 *k,int s,int e)

{
  template_ElementType<3UL> *ptVar1;
  int iVar2;
  
  while (iVar2 = e, s != iVar2) {
    e = s + iVar2 >> 1;
    ptVar1 = GetField<3ul>(this);
    if ((ptVar1[e]._M_t.super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
         super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
         super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl)->metric <= *(double *)*k) {
      s = e + 1;
      e = iVar2;
    }
  }
  return (SearchResult<int,_false>)iVar2;
}

Assistant:

SearchResult<int, false> binary_search_impl(
      const K &k, int s, int e, const Compare &comp,
      std::false_type /* IsCompareTo */) const {
    while (s != e) {
      const int mid = (s + e) >> 1;
      if (comp(key(mid), k)) {
        s = mid + 1;
      } else {
        e = mid;
      }
    }
    return SearchResult<int, false>{s};
  }